

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkTopmost(Abc_Ntk_t *pNtk,int nLevels)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int LevelCut;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcStrash.c"
                  ,0x229,"Abc_Ntk_t *Abc_NtkTopmost(Abc_Ntk_t *, int)");
  }
  if (pNtk->vCos->nSize == 1) {
    iVar3 = Abc_AigLevel(pNtk);
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    pcVar4 = Extra_UtilStrsav(pNtk->pName);
    pNtk_00->pName = pcVar4;
    pAVar5 = Abc_AigConst1(pNtk_00);
    pAVar6 = Abc_AigConst1(pNtk);
    (pAVar6->field_6).pCopy = pAVar5;
    Abc_NtkCleanCopy(pNtk);
    if (0 < pNtk->vPos->nSize) {
      LevelCut = 0;
      if (0 < iVar3 - nLevels) {
        LevelCut = iVar3 - nLevels;
      }
      plVar2 = (long *)*pNtk->vPos->pArray;
      pAVar5 = Abc_NtkTopmost_rec(pNtk_00,*(Abc_Obj_t **)
                                           (*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8),LevelCut);
      if (0 < pNtk->vPos->nSize) {
        uVar1 = *(uint *)((long)*pNtk->vPos->pArray + 0x14);
        pAVar6 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
        Abc_ObjAddFanin(pAVar6,(Abc_Obj_t *)((ulong)(uVar1 >> 10 & 1) ^ (ulong)pAVar5));
        Abc_NtkAddDummyPiNames(pNtk_00);
        if (0 < pNtk->vPos->nSize) {
          pcVar4 = Abc_ObjName((Abc_Obj_t *)*pNtk->vPos->pArray);
          Abc_ObjAssignName(pAVar6,pcVar4,(char *)0x0);
          iVar3 = Abc_NtkCheck(pNtk_00);
          if (iVar3 == 0) {
            puts("Abc_NtkTopmost: The network check has failed.");
            Abc_NtkDelete(pNtk_00);
            pNtk_00 = (Abc_Ntk_t *)0x0;
          }
          return pNtk_00;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Abc_NtkCoNum(pNtk) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcStrash.c"
                ,0x22a,"Abc_Ntk_t *Abc_NtkTopmost(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkTopmost( Abc_Ntk_t * pNtk, int nLevels )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew, * pObjPo;
    int LevelCut;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkCoNum(pNtk) == 1 );
    // get the cutoff level
    LevelCut = Abc_MaxInt( 0, Abc_AigLevel(pNtk) - nLevels );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // create PIs below the cut and nodes above the cut
    Abc_NtkCleanCopy( pNtk );
    pObjNew = Abc_NtkTopmost_rec( pNtkNew, Abc_ObjFanin0(Abc_NtkPo(pNtk, 0)), LevelCut );
    pObjNew = Abc_ObjNotCond( pObjNew, Abc_ObjFaninC0(Abc_NtkPo(pNtk, 0)) );
    // add the PO node and name
    pObjPo = Abc_NtkCreatePo(pNtkNew);
    Abc_ObjAddFanin( pObjPo, pObjNew );
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_ObjAssignName( pObjPo, Abc_ObjName(Abc_NtkPo(pNtk, 0)), NULL );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkTopmost: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}